

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O0

_Bool bitset_container_is_subset_run(bitset_container_t *container1,run_container_t *container2)

{
  int iVar1;
  bool bVar2;
  short sVar3;
  ulong uVar4;
  ushort uVar5;
  int iVar6;
  uint uVar7;
  uint16_t r;
  uint64_t t;
  uint32_t stop;
  uint32_t start;
  uint64_t w;
  int32_t i_run;
  int32_t i_bitset;
  run_container_t *container2_local;
  bitset_container_t *container1_local;
  
  if ((container1->cardinality == -1) ||
     (iVar1 = container1->cardinality, iVar6 = run_container_cardinality(container2), iVar1 <= iVar6
     )) {
    w._4_4_ = 0;
    w._0_4_ = 0;
    while( true ) {
      bVar2 = false;
      if (w._4_4_ < 0x400) {
        bVar2 = (int)w < container2->n_runs;
      }
      if (!bVar2) {
        if (w._4_4_ < 0x400) {
          for (; w._4_4_ < 0x400; w._4_4_ = w._4_4_ + 1) {
            if (container1->words[w._4_4_] != 0) {
              return false;
            }
          }
        }
        return true;
      }
      _stop = container1->words[w._4_4_];
      while( true ) {
        bVar2 = false;
        if (_stop != 0) {
          bVar2 = (int)w < container2->n_runs;
        }
        if (!bVar2) break;
        uVar7 = (uint)container2->runs[(int)w].value;
        sVar3 = 0;
        for (uVar4 = _stop; (uVar4 & 1) == 0; uVar4 = uVar4 >> 1 | 0x8000000000000000) {
          sVar3 = sVar3 + 1;
        }
        uVar5 = (short)(w._4_4_ << 6) + sVar3;
        if (uVar5 < uVar7) {
          return false;
        }
        if (uVar7 + container2->runs[(int)w].length < (uint)uVar5) {
          w._0_4_ = (int)w + 1;
        }
        else {
          _stop = _stop & (_stop ^ 0xffffffffffffffff) + 1 ^ _stop;
        }
      }
      if (_stop != 0) break;
      w._4_4_ = w._4_4_ + 1;
    }
  }
  return false;
}

Assistant:

bool bitset_container_is_subset_run(const bitset_container_t* container1,
                                    const run_container_t* container2) {
    // todo: this code could be much faster
    if (container1->cardinality != BITSET_UNKNOWN_CARDINALITY) {
        if (container1->cardinality > run_container_cardinality(container2)) {
            return false;
        }
    }
    int32_t i_bitset = 0, i_run = 0;
    while (i_bitset < BITSET_CONTAINER_SIZE_IN_WORDS &&
           i_run < container2->n_runs) {
        uint64_t w = container1->words[i_bitset];
        while (w != 0 && i_run < container2->n_runs) {
            uint32_t start = container2->runs[i_run].value;
            uint32_t stop = start + container2->runs[i_run].length;
            uint64_t t = w & (~w + 1);
            uint16_t r = i_bitset * 64 + __builtin_ctzll(w);
            if (r < start) {
                return false;
            } else if (r > stop) {
                i_run++;
                continue;
            } else {
                w ^= t;
            }
        }
        if (w == 0) {
            i_bitset++;
        } else {
            return false;
        }
    }
    if (i_bitset < BITSET_CONTAINER_SIZE_IN_WORDS) {
        // terminated iterating on the run containers, check that rest of bitset
        // is empty
        for (; i_bitset < BITSET_CONTAINER_SIZE_IN_WORDS; i_bitset++) {
            if (container1->words[i_bitset] != 0) {
                return false;
            }
        }
    }
    return true;
}